

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::
SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
::
emplaceRealloc<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
          (SmallVectorBase<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>>
           *this,pointer pos,
          tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
          *args)

{
  ulong uVar1;
  move_iterator<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*>
  __first;
  undefined8 uVar2;
  tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
  *__result;
  ulong uVar3;
  move_iterator<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*>
  __last;
  long lVar4;
  
  if (*(long *)(this + 8) != 0x555555555555555) {
    uVar3 = *(long *)(this + 8) + 1;
    uVar1 = *(ulong *)(this + 0x10);
    if (uVar3 < uVar1 * 2) {
      uVar3 = uVar1 * 2;
    }
    if (0x555555555555555 - uVar1 < uVar1) {
      uVar3 = 0x555555555555555;
    }
    lVar4 = (long)pos - *(long *)this;
    __result = (tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                *)operator_new(uVar3 * 0x18);
    uVar2 = *(undefined8 *)
             ((long)&(args->
                     super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                     ).
                     super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                     .
                     super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                     ._M_head_impl.
                     super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     .
                     super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     .
                     super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
             + 8);
    *(undefined8 *)((long)__result + lVar4) =
         *(undefined8 *)
          &(args->
           super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
           ).
           super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
           .
           super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
           ._M_head_impl.
           super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           .
           super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
           .
           super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
    ;
    ((undefined8 *)((long)__result + lVar4))[1] = uVar2;
    *(Symbol **)((long)__result + lVar4 + 0x10) =
         (args->
         super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
         ).super__Head_base<0UL,_const_slang::ast::Symbol_*,_false>._M_head_impl;
    __first._M_current =
         *(tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
           **)this;
    __last._M_current = __first._M_current + *(long *)(this + 8);
    if (__last._M_current == pos) {
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>*>,std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>*>
                (__first,__last,__result);
    }
    else {
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>*>,std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>*>
                (__first,(move_iterator<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*>
                          )pos,__result);
      __last._M_current =
           (tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
            *)(*(long *)(this + 8) * 0x18 + *(long *)this);
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>*>,std::tuple<slang::ast::Symbol_const*,std::variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>>*>
                ((move_iterator<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_*>
                  )pos,__last,(pointer)((long)__result + lVar4) + 1);
    }
    SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
    ::cleanup((SmallVectorBase<std::tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>_>
               *)this,(EVP_PKEY_CTX *)__last._M_current);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar3;
    *(tuple<const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
      **)this = __result;
    return (pointer)((long)__result + lVar4);
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}